

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_solution.hpp
# Opt level: O3

Spins * __thiscall
openjij::result::get_solution<openjij::graph::Dense<double>>
          (Spins *__return_storage_ptr__,result *this,
          ClassicalIsing<openjij::graph::Dense<double>_> *system)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  pointer piVar4;
  ulong uVar5;
  ulong uVar6;
  allocator_type local_11;
  
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,*(size_type *)(this + 0x28),&local_11);
  uVar1 = *(ulong *)(this + 0x28);
  if (uVar1 != 0) {
    lVar2 = *(long *)this;
    uVar3 = *(ulong *)(this + 8);
    piVar4 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = 0;
    uVar5 = uVar3;
    if ((long)uVar3 < 1) {
      uVar5 = uVar6;
    }
    do {
      if ((uVar5 == uVar6) || (uVar3 <= uVar1 || (long)uVar1 < 0)) {
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                     );
      }
      piVar4[uVar6] = (int)(*(double *)(lVar2 + uVar6 * 8) * *(double *)(lVar2 + uVar1 * 8));
      uVar6 = uVar6 + 1;
    } while (uVar1 != uVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

const graph::Spins
get_solution(const system::ClassicalIsing<GraphType> &system) {
  // convert from Eigen::Vector to std::vector
  graph::Spins ret_spins(system.num_spins);
  for (std::size_t i = 0; i < system.num_spins; i++) {
    ret_spins[i] = static_cast<graph::Spin>(system.spin(i) *
                                            system.spin(system.num_spins));
  }
  return ret_spins;
}